

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O2

void unlock_current_page(ALLEGRO_TTF_FONT_DATA *data)

{
  char cVar1;
  undefined8 *puVar2;
  
  if (data->page_lr != (ALLEGRO_LOCKED_REGION *)0x0) {
    puVar2 = (undefined8 *)_al_vector_ref_back(&data->page_bitmaps);
    al_unlock_bitmap(*puVar2);
    data->page_lr = (ALLEGRO_LOCKED_REGION *)0x0;
    cVar1 = _al_trace_prefix("font",0,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                             ,0xa6,"unlock_current_page");
    if (cVar1 != '\0') {
      _al_trace_suffix("Unlocking page: %p\n",*puVar2);
      return;
    }
  }
  return;
}

Assistant:

static void unlock_current_page(ALLEGRO_TTF_FONT_DATA *data)
{
   if (data->page_lr) {
      ALLEGRO_BITMAP **back = _al_vector_ref_back(&data->page_bitmaps);
      ASSERT(al_is_bitmap_locked(*back));
      al_unlock_bitmap(*back);
      data->page_lr = NULL;
      ALLEGRO_DEBUG("Unlocking page: %p\n", *back);
   }
}